

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemComboBox.cpp
# Opt level: O0

void __thiscall
QFileSystemComboBoxPrivate::QFileSystemComboBoxPrivate
          (QFileSystemComboBoxPrivate *this,QFileSystemComboBox *widgetP)

{
  QObject *pQVar1;
  Object *sender;
  QFlags_conflict1 *pQVar2;
  anon_class_8_1_8991fb9c_for_function slot;
  QObject *in_RSI;
  QObject *in_RDI;
  undefined1 auVar3 [12];
  QFileSystemComboBoxCompleter *completer;
  undefined1 in_stack_fffffffffffffe8f;
  QFileSystemListView *in_stack_fffffffffffffe90;
  QAbstractItemModel *in_stack_fffffffffffffe98;
  QFileSystemComboBoxCompleter *in_stack_fffffffffffffea0;
  QWidget *in_stack_fffffffffffffec8;
  QModelIndex *pQVar4;
  QFileSystemListView *in_stack_fffffffffffffed0;
  QAbstractItemModel *pQVar5;
  undefined8 in_stack_fffffffffffffed8;
  undefined1 browsable;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  anon_class_8_1_8991fb9c_for_function in_stack_ffffffffffffff08;
  ConnectionType in_stack_ffffffffffffff30;
  Connection local_b0 [8];
  code *local_a8;
  undefined8 local_a0;
  Connection local_90 [8];
  code *local_88;
  undefined8 local_80;
  Connection local_70 [8];
  code *local_68;
  undefined8 local_60;
  Connection local_50 [12];
  QFlags<Qt::MatchFlag> local_44;
  QFlags_conflict1 *local_40;
  undefined4 local_1c;
  undefined8 local_18;
  QObject *local_10;
  
  browsable = (undefined1)((ulong)in_stack_fffffffffffffed8 >> 0x38);
  local_10 = in_RSI;
  QObject::QObject(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR_metaObject_0026be48;
  *(QObject **)(in_RDI + 0x10) = local_10;
  pQVar1 = in_RDI + 0x18;
  sender = (Object *)operator_new(0x30);
  QFileSystemListView::QFileSystemListView(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  *(Object **)pQVar1 = sender;
  in_RDI[0x20] = (QObject)0x1;
  pQVar1 = in_RDI + 0x28;
  std::optional<std::pair<int,_QFileInfo>_>::optional
            ((optional<std::pair<int,_QFileInfo>_> *)0x2228b3);
  if (*(long *)(in_RDI + 0x10) != 0) {
    QFileSystemListView::setBrowsable
              ((QFileSystemListView *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (bool)browsable);
    QFileSystemListView::setReadOnly(in_stack_fffffffffffffe90,(bool)in_stack_fffffffffffffe8f);
    QObject::blockSignals(SUB81(*(undefined8 *)(in_RDI + 0x10),0));
    QComboBox::setEditable(SUB81(*(undefined8 *)(in_RDI + 0x10),0));
    pQVar5 = *(QAbstractItemModel **)(in_RDI + 0x10);
    QAbstractItemView::model();
    QComboBox::setModel(pQVar5);
    QComboBox::setView(*(QAbstractItemView **)(in_RDI + 0x10));
    pQVar4 = *(QModelIndex **)(in_RDI + 0x10);
    QAbstractItemView::rootIndex();
    QComboBox::setRootModelIndex(pQVar4);
    QComboBox::setCurrentIndex((int)*(undefined8 *)(in_RDI + 0x10));
    pQVar2 = (QFlags_conflict1 *)operator_new(0x10);
    QAbstractItemView::model();
    QFileSystemComboBoxCompleter::QCompleter
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               (QObject *)in_stack_fffffffffffffe90);
    local_40 = pQVar2;
    QCompleter::setCaseSensitivity((CaseSensitivity)pQVar2);
    QCompleter::setCompletionRole((int)local_40);
    pQVar2 = local_40;
    QFlags<Qt::MatchFlag>::QFlags(&local_44,MatchContains);
    QCompleter::setFilterMode(pQVar2);
    QCompleter::setModelSorting((ModelSorting)local_40);
    QComboBox::setCompleter(*(QCompleter **)(in_RDI + 0x10));
    QComboBox::model();
    local_68 = QAbstractItemModel::layoutAboutToBeChanged;
    local_60 = 0;
    QObject::
    connect<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),QFileSystemComboBoxPrivate::QFileSystemComboBoxPrivate(QFileSystemComboBox*)::_lambda()_1_>
              ((Object *)sender,(offset_in_QAbstractItemModel_to_subr)in_RDI,pQVar1,
               (anon_class_8_1_8991fb9c_for_function)in_stack_ffffffffffffff08.this,
               in_stack_ffffffffffffff30);
    QMetaObject::Connection::~Connection(local_50);
    QComboBox::model();
    local_88 = QAbstractItemModel::layoutChanged;
    local_80 = 0;
    QObject::
    connect<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),QFileSystemComboBoxPrivate::QFileSystemComboBoxPrivate(QFileSystemComboBox*)::_lambda()_2_>
              ((Object *)sender,(offset_in_QAbstractItemModel_to_subr)in_RDI,pQVar1,
               (anon_class_8_1_8991fb9c_for_function)in_stack_ffffffffffffff08.this,
               in_stack_ffffffffffffff30);
    QMetaObject::Connection::~Connection(local_70);
    local_a8 = QFileSystemListView::directoryLoaded;
    local_a0 = 0;
    QObject::
    connect<void(QFileSystemListView::*)(QString_const&),QFileSystemComboBoxPrivate::QFileSystemComboBoxPrivate(QFileSystemComboBox*)::_lambda(QString_const&)_1_>
              (sender,(offset_in_QFileSystemListView_to_subr)in_RDI,pQVar1,
               (anon_class_8_1_8991fb9c_for_function)in_stack_ffffffffffffff08.this,
               in_stack_ffffffffffffff30);
    QMetaObject::Connection::~Connection(local_90);
    QObject::
    connect<void(QFileSystemListView::*)(QString_const&),QFileSystemComboBoxPrivate::QFileSystemComboBoxPrivate(QFileSystemComboBox*)::_lambda(QString_const&)_2_>
              (sender,(offset_in_QFileSystemListView_to_subr)in_RDI,pQVar1,in_stack_ffffffffffffff08
               ,in_stack_ffffffffffffff30);
    QMetaObject::Connection::~Connection(local_b0);
    slot.this = (QFileSystemComboBoxPrivate *)
                QNonConstOverload<int>::operator()
                          ((QNonConstOverload<int> *)&qOverload<int>,
                           (offset_in_QComboBox_to_subr)QComboBox::currentIndexChanged);
    QObject::
    connect<void(QComboBox::*)(int),QFileSystemComboBoxPrivate::QFileSystemComboBoxPrivate(QFileSystemComboBox*)::_lambda(int)_1_>
              ((Object *)sender,(offset_in_QComboBox_to_subr)in_RDI,pQVar1,slot,
               in_stack_ffffffffffffff30);
    QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffff30);
    return;
  }
  auVar3 = qt_assert("widget",
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/pasnox[P]qtwidgetsextra/qtwidgetsextra/QtWidgetsExtra/FileSystem/QFileSystemComboBox.cpp"
                     ,0x24);
  local_1c = auVar3._8_4_;
  local_18 = auVar3._0_8_;
  QObject::~QObject(in_RDI);
  _Unwind_Resume(local_18);
}

Assistant:

explicit QFileSystemComboBoxPrivate(QFileSystemComboBox *widgetP)
        : QObject(widgetP)
        , widget(widgetP)
        , view(new QFileSystemListView(widget)) {
        Q_ASSERT(widget);

        view->setBrowsable(false);
        view->setReadOnly(true);

        widget->blockSignals(true);
        widget->QComboBox::setEditable(true);
        widget->QComboBox::setModel(view->model());
        widget->QComboBox::setView(view);
        widget->QComboBox::setRootModelIndex(view->rootIndex());
        widget->QComboBox::setCurrentIndex(-1);

        auto completer = new QFileSystemComboBoxCompleter(view->model(), this);
        completer->setCaseSensitivity(Qt::CaseInsensitive);
        completer->setCompletionRole(Qt::DisplayRole);
        completer->setFilterMode(Qt::MatchContains);
        completer->setModelSorting(QCompleter::CaseInsensitivelySortedModel);
        widget->setCompleter(completer);

        // QFileSystemModel sorting is delayed and use layoutChanged.
        // And QComboBox model watching does not listen to layoutChanged...

        connect(widget->QComboBox::model(), &QAbstractItemModel::layoutAboutToBeChanged, widget, [this]() {
            if (!initialSorting && !layoutValue) {
                layoutValue = qMakePair(widget->currentIndex(), QFileInfo(widget->currentFilePath()));
            }
        });
        connect(widget->QComboBox::model(), &QAbstractItemModel::layoutChanged, widget, [this]() {
            if (initialSorting && !layoutValue && widget->QComboBox::model()->rowCount(widget->QComboBox::rootModelIndex()) > 0) {
                layoutValue = qMakePair(0, QFileInfo(widget->filePath(0)));
            }

            initialSorting = false;

            bool done = false;

            if (layoutValue) {
                Q_ASSERT(layoutValue->second.filePath().isEmpty() || view->rootPath() == layoutValue->second.path());

                // If we have both a valid index and file path, both needs to match
                if (layoutValue->first >= 0 && !layoutValue->second.filePath().isEmpty()) {
                    done = true;
                    widget->QComboBox::setCurrentIndex(layoutValue->first);
                } else if (layoutValue->first >= 0) {
                    done = true;
                    widget->QComboBox::setCurrentIndex(layoutValue->first);
                } else if (!layoutValue->second.filePath().isEmpty()) {
                    done = true;
                    widget->QComboBox::setCurrentIndex(widget->findFileName(layoutValue->second.fileName()));
                } else {
                    Q_UNREACHABLE();
                }
            }

            layoutValue.reset();

            if (!done) {
                widget->QComboBox::setCurrentIndex(-1);
            }
        });

        connect(view, &QFileSystemListView::directoryLoaded, this, [this](const QString &path) {
            if (widget->signalsBlocked()) {
                widget->blockSignals(false);
            }

            Q_EMIT widget->directoryLoaded(path);
        });

        connect(view, &QFileSystemListView::rootPathChanged, this, [this](const QString &path) {
            widget->QComboBox::setRootModelIndex(view->rootIndex());
            Q_EMIT widget->rootPathChanged(path);
        });

        connect(widget, qOverload<int>(&QComboBox::currentIndexChanged), this, [this](int index) {
            Q_EMIT widget->currentFileNameChanged(widget->fileName(index));
            Q_EMIT widget->currentFilePathChanged(widget->filePath(index));
        });
    }